

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_thread_identity.cc
# Opt level: O0

void absl::lts_20250127::synchronization_internal::ResetThreadIdentityBetweenReuse
               (ThreadIdentity *identity)

{
  PerThreadSynch *pts;
  ThreadIdentity *identity_local;
  memory_order __b_1;
  memory_order __b;
  
  (identity->per_thread_synch).next = (PerThreadSynch *)0x0;
  (identity->per_thread_synch).skip = (PerThreadSynch *)0x0;
  (identity->per_thread_synch).may_skip = false;
  (identity->per_thread_synch).waitp = (SynchWaitParams *)0x0;
  (identity->per_thread_synch).suppress_fatal_errors = false;
  (identity->per_thread_synch).readers = 0;
  (identity->per_thread_synch).priority = 0;
  (identity->per_thread_synch).next_priority_read_cycles = 0;
  std::atomic<absl::lts_20250127::base_internal::PerThreadSynch::State>::store
            (&(identity->per_thread_synch).state,kAvailable,memory_order_relaxed);
  (identity->per_thread_synch).maybe_unlocking = false;
  (identity->per_thread_synch).wake = false;
  (identity->per_thread_synch).cond_waiter = false;
  (identity->per_thread_synch).all_locks = (SynchLocksHeld *)0x0;
  identity->blocked_count_ptr = (atomic<int> *)0x0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (identity->ticker).super___atomic_base<int>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (identity->wait_start).super___atomic_base<int>._M_i = 0;
  std::atomic<bool>::store(&identity->is_idle,false,memory_order_relaxed);
  identity->next = (ThreadIdentity *)0x0;
  return;
}

Assistant:

static void ResetThreadIdentityBetweenReuse(
    base_internal::ThreadIdentity* identity) {
  base_internal::PerThreadSynch* pts = &identity->per_thread_synch;
  pts->next = nullptr;
  pts->skip = nullptr;
  pts->may_skip = false;
  pts->waitp = nullptr;
  pts->suppress_fatal_errors = false;
  pts->readers = 0;
  pts->priority = 0;
  pts->next_priority_read_cycles = 0;
  pts->state.store(base_internal::PerThreadSynch::State::kAvailable,
                   std::memory_order_relaxed);
  pts->maybe_unlocking = false;
  pts->wake = false;
  pts->cond_waiter = false;
  pts->all_locks = nullptr;
  identity->blocked_count_ptr = nullptr;
  identity->ticker.store(0, std::memory_order_relaxed);
  identity->wait_start.store(0, std::memory_order_relaxed);
  identity->is_idle.store(false, std::memory_order_relaxed);
  identity->next = nullptr;
}